

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O3

bool __thiscall Game::OnUserUpdate(Game *this,float fElapsedTime)

{
  int64_t *piVar1;
  StatusBar *this_00;
  SpeechBubble *pSVar2;
  pointer psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  element_type *peVar8;
  ulong uVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  element_type *peVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  uint uVar13;
  bool bVar14;
  HWButton HVar15;
  result_type rVar16;
  int iVar17;
  int32_t iVar18;
  int32_t iVar19;
  Pixel PVar20;
  vi2d *pvVar21;
  Decal *pDVar22;
  Sprite *pSVar23;
  ulong uVar24;
  uint *puVar25;
  Renderable *pRVar26;
  ulong __val;
  uint __len;
  float fVar27;
  string __str;
  string local_2e8;
  vf2d local_2c8;
  undefined1 local_2c0 [24];
  undefined1 local_2a8 [16];
  vi2d local_298;
  vi2d local_290;
  vi2d local_288;
  vi2d local_280;
  shared_ptr<olc::Renderable> local_278;
  shared_ptr<olc::Renderable> local_268;
  shared_ptr<olc::Renderable> local_258;
  shared_ptr<olc::Renderable> local_248;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  element_type *local_218;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_210;
  Wav local_208;
  float local_160;
  vi2d local_15c;
  vi2d vStack_154;
  SkillTree *local_148;
  int64_t *local_140;
  vf2d local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  switch(this->state) {
  case MENU:
    pvVar21 = olc::PixelGameEngine::GetMousePos(&this->super_PixelGameEngine);
    iVar17 = pvVar21->x;
    iVar7 = pvVar21->y;
    iVar18 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    if ((((iVar18 / 2 + -0x32 <= iVar17) &&
         (iVar18 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine),
         iVar17 <= iVar18 / 2 + 0x32)) &&
        (iVar18 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine),
        iVar18 / 2 + -10 <= iVar7)) &&
       (((iVar18 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine),
         iVar7 <= iVar18 / 2 + 10 &&
         (HVar15 = olc::PixelGameEngine::GetMouse(&this->super_PixelGameEngine,0),
         ((uint3)HVar15 & 1) != 0)) && (this->started == false)))) {
      this->started = true;
    }
    fVar27 = this->menuFadeTimer;
    if (this->started == true) {
      fVar27 = fVar27 + fElapsedTime;
      this->menuFadeTimer = fVar27;
    }
    if (2.0 <= fVar27) {
      this->state = FIRST_PHASE;
    }
    iVar18 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    local_238._0_8_ = &local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,"The Great\n   MMO  \n Machine ","");
    olc::PixelGameEngine::GetTextSize((PixelGameEngine *)local_2c0,(string *)this);
    local_2c8.x = (float)(iVar18 / 2) - (float)(int)local_2c0._0_8_;
    local_2c8.y = 40.0 - (float)SUB84(local_2c0._0_8_,4);
    paVar4 = &local_2e8.field_2;
    local_2e8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e8,"The Great\n   MMO  \n Machine ","");
    local_138.x = 2.0;
    local_138.y = 2.0;
    olc::PixelGameEngine::DrawStringDecal
              (&this->super_PixelGameEngine,&local_2c8,&local_2e8,(Pixel)olc::BLUE.field_1,
               &local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != paVar4) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._0_8_ != &local_228) {
      operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
    }
    iVar18 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    iVar19 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    local_238._0_4_ = (float)(iVar18 / 2) + -50.0;
    local_238._4_4_ = (float)(iVar19 / 2) + -10.0;
    local_2e8._M_dataplus._M_p = (pointer)0x41a0000042c80000;
    olc::PixelGameEngine::FillRectDecal
              (&this->super_PixelGameEngine,(vf2d *)local_238,(vf2d *)&local_2e8,
               (Pixel)olc::WHITE.field_1);
    iVar18 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    iVar19 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    local_238._0_8_ = &local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"Play","");
    olc::PixelGameEngine::GetTextSize((PixelGameEngine *)local_2c0,(string *)this);
    local_2c8.x = (float)(iVar18 / 2) - (float)((int)local_2c0._0_8_ / 2);
    local_2c8.y = (float)(iVar19 / 2) - (float)(SUB84(local_2c0._0_8_,4) / 2);
    local_2e8._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"Play","");
    local_138.x = 1.0;
    local_138.y = 1.0;
    olc::PixelGameEngine::DrawStringDecal
              (&this->super_PixelGameEngine,&local_2c8,&local_2e8,(Pixel)olc::BLUE.field_1,
               &local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != paVar4) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._0_8_ != &local_228) {
      operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
    }
    local_238._0_4_ = 0.0;
    local_238._4_4_ = 0.0;
    iVar18 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    iVar19 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    local_2e8._M_dataplus._M_p = (pointer)CONCAT44((float)iVar19,(float)iVar18);
    fVar27 = this->menuFadeTimer * 0.5;
    goto LAB_0011740f;
  case FIRST_PHASE:
    switch(this->cutsceneState) {
    case 0:
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Hmm, I really need a new\nvideo idea...","");
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"res/sounds/hmm.wav","");
      iVar18 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      local_280.y = iVar18 + -0x40;
      local_280.x = 0x46;
      iVar18 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
      local_288.x = iVar18 + -0x4c;
      local_288.y = 0x40;
      local_248.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->speechBubbleSprite).
           super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_248.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this->speechBubbleSprite).
           super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((vi2d)local_248.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (vi2d)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)
           ((long)local_248.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 8) =
               *(_Atomic_word *)
                ((long)local_248.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)
           ((long)local_248.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 8) =
               *(_Atomic_word *)
                ((long)local_248.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 8) + 1;
        }
      }
      SpeechBubble::SpeechBubble
                ((SpeechBubble *)local_238,&local_50,&local_70,&local_280,&local_288,&local_248);
      std::__cxx11::string::operator=((string *)&this->currentSpeechBubble,(string *)local_238);
      _Var12._M_pi = _Stack_210._M_pi;
      peVar11 = local_218;
      local_218 = (element_type *)0x0;
      _Stack_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var10 = (this->currentSpeechBubble).sprite.
                super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (this->currentSpeechBubble).sprite.
      super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar11;
      (this->currentSpeechBubble).sprite.
      super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var12._M_pi;
      if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
      }
      puVar25 = &local_208.super_AudioSource.mFlags;
      memcpy(&(this->currentSpeechBubble).soundSample.super_AudioSource.mFlags,puVar25,0x90);
      (this->currentSpeechBubble).soundSample.mData = local_208.mData;
      (this->currentSpeechBubble).soundSample.mSampleCount = local_208.mSampleCount;
      (this->currentSpeechBubble).timeElapsed = local_160;
      (this->currentSpeechBubble).position = local_15c;
      (this->currentSpeechBubble).scale = vStack_154;
      SoLoud::Wav::~Wav(&local_208,(int)puVar25);
      if ((Sprite *)_Stack_210._M_pi != (Sprite *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_210._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._0_8_ != &local_228) {
        operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
      }
      if ((vi2d)local_248.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (vi2d)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_248.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      SpeechBubble::play(&this->currentSpeechBubble,&this->soloud);
      this->cutsceneState = 1;
      break;
    case 1:
      pSVar2 = &this->currentSpeechBubble;
      fVar27 = SpeechBubble::getTimePastEnd(pSVar2);
      if (3.0 <= fVar27) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"I know, I\'m gonna make an mmo","");
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"res/sounds/iknow.wav","");
        iVar18 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        local_290.y = iVar18 + -0x40;
        local_290.x = 0x46;
        iVar18 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        local_298.x = iVar18 + -0x4c;
        local_298.y = 0x40;
        local_258.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (this->speechBubbleSprite).
             super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_258.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (this->speechBubbleSprite).
               super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_258.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_258.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_258.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_258.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_258.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        SpeechBubble::SpeechBubble
                  ((SpeechBubble *)local_238,&local_90,&local_b0,&local_290,&local_298,&local_258);
        SpeechBubble::operator=(pSVar2,(SpeechBubble *)local_238);
        SpeechBubble::~SpeechBubble((SpeechBubble *)local_238);
        if (local_258.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_258.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        SpeechBubble::play(pSVar2,&this->soloud);
        this->cutsceneState = 2;
      }
      break;
    case 2:
      fVar27 = SpeechBubble::getTimePastEnd(&this->currentSpeechBubble);
      if (3.0 <= fVar27) {
        this->cutsceneState = 3;
      }
      break;
    case 3:
      HVar15 = olc::PixelGameEngine::GetKey(&this->super_PixelGameEngine,A);
      if (((uint3)HVar15 & 1) != 0) {
        this->aPressed = true;
      }
      HVar15 = olc::PixelGameEngine::GetKey(&this->super_PixelGameEngine,D);
      if ((((uint3)HVar15 & 1) != 0) && (this->aPressed == true)) {
        StatusBar::addWork(&this->statusBar);
        this->aPressed = false;
        this->pressCounter = this->pressCounter + 1;
      }
      if (this->pressCounter == 0x1e) {
        this->cutsceneState = 4;
      }
      break;
    case 4:
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"Eugh, this is going slowly","");
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"res/sounds/eughh.wav","")
      ;
      iVar18 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      local_2a8._12_4_ = iVar18 + -0x40;
      local_2a8._8_4_ = 0x46;
      iVar18 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
      local_2a8._0_4_ = iVar18 + -0x4c;
      local_2a8._4_4_ = 0x40;
      local_268.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->speechBubbleSprite).
           super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_268.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (this->speechBubbleSprite).
           super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_268.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_268.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_268.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_268.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_268.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      SpeechBubble::SpeechBubble
                ((SpeechBubble *)local_238,&local_d0,&local_f0,(vi2d *)(local_2a8 + 8),
                 (vi2d *)local_2a8,&local_268);
      std::__cxx11::string::operator=((string *)&this->currentSpeechBubble,(string *)local_238);
      _Var12._M_pi = _Stack_210._M_pi;
      peVar11 = local_218;
      local_218 = (element_type *)0x0;
      _Stack_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var10 = (this->currentSpeechBubble).sprite.
                super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (this->currentSpeechBubble).sprite.
      super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar11;
      (this->currentSpeechBubble).sprite.
      super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var12._M_pi;
      if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
      }
      puVar25 = &local_208.super_AudioSource.mFlags;
      memcpy(&(this->currentSpeechBubble).soundSample.super_AudioSource.mFlags,puVar25,0x90);
      (this->currentSpeechBubble).soundSample.mData = local_208.mData;
      (this->currentSpeechBubble).soundSample.mSampleCount = local_208.mSampleCount;
      (this->currentSpeechBubble).timeElapsed = local_160;
      (this->currentSpeechBubble).position = local_15c;
      (this->currentSpeechBubble).scale = vStack_154;
      SoLoud::Wav::~Wav(&local_208,(int)puVar25);
      if ((Sprite *)_Stack_210._M_pi != (Sprite *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_210._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._0_8_ != &local_228) {
        operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
      }
      if (local_268.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_268.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      SpeechBubble::play(&this->currentSpeechBubble,&this->soloud);
      this->cutsceneState = 5;
      break;
    case 5:
      pSVar2 = &this->currentSpeechBubble;
      fVar27 = SpeechBubble::getTimePastEnd(pSVar2);
      if (3.0 <= fVar27) {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,
                   "I know, I\'m gonna make an mmo\nmaking machine, there\'s no\nway that goes wrong"
                   ,"");
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_130,"res/sounds/mmo.wav","");
        iVar18 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        local_2c0._20_4_ = iVar18 + -0x40;
        local_2c0._16_4_ = 0x46;
        iVar18 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        local_2c0._8_4_ = iVar18 + -0x4c;
        local_2c0._12_4_ = 0x40;
        local_278.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (this->speechBubbleSprite).
             super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_278.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (this->speechBubbleSprite).
               super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if ((vi2d)local_278.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (vi2d)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)
             ((long)local_278.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 8) =
                 *(_Atomic_word *)
                  ((long)local_278.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)
             ((long)local_278.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 8) =
                 *(_Atomic_word *)
                  ((long)local_278.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 8) + 1;
          }
        }
        SpeechBubble::SpeechBubble
                  ((SpeechBubble *)local_238,&local_110,&local_130,(vi2d *)(local_2c0 + 0x10),
                   (vi2d *)(local_2c0 + 8),&local_278);
        SpeechBubble::operator=(pSVar2,(SpeechBubble *)local_238);
        SpeechBubble::~SpeechBubble((SpeechBubble *)local_238);
        if ((vi2d)local_278.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (vi2d)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_278.super___shared_ptr<olc::Renderable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        SpeechBubble::play(pSVar2,&this->soloud);
        this->cutsceneState = 6;
      }
      break;
    case 6:
      fVar27 = SpeechBubble::getTimePastEnd(&this->currentSpeechBubble);
      if (3.0 <= fVar27) {
        this->cutsceneState = 7;
      }
      break;
    case 7:
      fVar27 = this->fadeoutTimer + fElapsedTime;
      this->fadeoutTimer = fVar27;
      if (4.0 <= fVar27) {
        this->state = MACHINE;
      }
    }
    SpeechBubble::tick(&this->currentSpeechBubble,fElapsedTime);
    iVar18 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    local_238._0_8_ = (ulong)(uint)((float)iVar18 + -64.0) << 0x20;
    pDVar22 = olc::Renderable::operator_cast_to_Decal_(&this->javidBaseSprite);
    local_2e8._M_dataplus._M_p = (pointer)0x4000000040000000;
    olc::PixelGameEngine::DrawDecal
              (&this->super_PixelGameEngine,(vf2d *)local_238,pDVar22,(vf2d *)&local_2e8,
               (Pixel *)&olc::WHITE.field_1);
    if (this->cutsceneState == 3) {
      pRVar26 = &this->aButtonSprite;
      if (this->aPressed == true) {
        iVar18 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        pSVar23 = olc::Renderable::Sprite(pRVar26);
        iVar17 = pSVar23->width;
        iVar19 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pSVar23 = olc::Renderable::Sprite(pRVar26);
        local_238._0_4_ = (undefined4)((iVar18 / 2 - iVar17) + -0x28);
        local_238._4_4_ = (undefined4)(iVar19 / 2 - pSVar23->height / 2);
        pDVar22 = olc::Renderable::operator_cast_to_Decal_(&this->aButtonPressedSprite);
        local_2e8._M_dataplus._M_p = (pointer)0x3f8000003f800000;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_238,pDVar22,(vf2d *)&local_2e8,
                   (Pixel *)&olc::WHITE.field_1);
        iVar18 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        iVar19 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pSVar23 = olc::Renderable::Sprite(&this->dButtonSprite);
        local_238._4_4_ = (float)(iVar19 / 2 - pSVar23->height / 2);
        local_238._0_4_ = (float)(iVar18 / 2 + 0x28);
        pDVar22 = olc::Renderable::operator_cast_to_Decal_(&this->dButtonSprite);
        local_2e8._M_dataplus._M_p = (pointer)0x3f8000003f800000;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_238,pDVar22,(vf2d *)&local_2e8,
                   (Pixel *)&olc::WHITE.field_1);
        iVar18 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        local_238._0_8_ = (ulong)(uint)((float)iVar18 + -64.0) << 0x20;
        pDVar22 = olc::Renderable::operator_cast_to_Decal_(&this->javidRArmDownSprite);
        local_2e8._M_dataplus._M_p = (pointer)0x4000000040000000;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_238,pDVar22,(vf2d *)&local_2e8,
                   (Pixel *)&olc::WHITE.field_1);
        iVar17 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pRVar26 = &this->javidLArmUpSprite;
      }
      else {
        iVar18 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        pSVar23 = olc::Renderable::Sprite(pRVar26);
        iVar17 = pSVar23->width;
        iVar19 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pSVar23 = olc::Renderable::Sprite(pRVar26);
        local_238._0_4_ = (undefined4)((iVar18 / 2 - iVar17) + -0x28);
        local_238._4_4_ = (undefined4)(iVar19 / 2 - pSVar23->height / 2);
        pDVar22 = olc::Renderable::operator_cast_to_Decal_(pRVar26);
        local_2e8._M_dataplus._M_p = (pointer)0x3f8000003f800000;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_238,pDVar22,(vf2d *)&local_2e8,
                   (Pixel *)&olc::WHITE.field_1);
        iVar18 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
        iVar19 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pSVar23 = olc::Renderable::Sprite(&this->dButtonSprite);
        local_238._4_4_ = (float)(iVar19 / 2 - pSVar23->height / 2);
        local_238._0_4_ = (float)(iVar18 / 2 + 0x28);
        pDVar22 = olc::Renderable::operator_cast_to_Decal_(&this->dButtonPressedSprite);
        local_2e8._M_dataplus._M_p = (pointer)0x3f8000003f800000;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_238,pDVar22,(vf2d *)&local_2e8,
                   (Pixel *)&olc::WHITE.field_1);
        iVar18 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        local_238._0_8_ = (ulong)(uint)((float)iVar18 + -64.0) << 0x20;
        pDVar22 = olc::Renderable::operator_cast_to_Decal_(&this->javidRArmUpSprite);
        local_2e8._M_dataplus._M_p = (pointer)0x4000000040000000;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_238,pDVar22,(vf2d *)&local_2e8,
                   (Pixel *)&olc::WHITE.field_1);
        iVar17 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pRVar26 = &this->javidLArmDownSprite;
      }
      local_238._0_8_ = (ulong)(uint)((float)iVar17 + -64.0) << 0x20;
      pDVar22 = olc::Renderable::operator_cast_to_Decal_(pRVar26);
      local_2e8._M_dataplus._M_p = (pointer)0x4000000040000000;
      olc::PixelGameEngine::DrawDecal
                (&this->super_PixelGameEngine,(vf2d *)local_238,pDVar22,(vf2d *)&local_2e8,
                 (Pixel *)&olc::WHITE.field_1);
    }
    else {
      iVar18 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      local_238._0_8_ = (ulong)(uint)((float)iVar18 + -64.0) << 0x20;
      pDVar22 = olc::Renderable::operator_cast_to_Decal_(&this->javidRArmDownSprite);
      local_2e8._M_dataplus._M_p = (pointer)0x4000000040000000;
      olc::PixelGameEngine::DrawDecal
                (&this->super_PixelGameEngine,(vf2d *)local_238,pDVar22,(vf2d *)&local_2e8,
                 (Pixel *)&olc::WHITE.field_1);
      iVar18 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      local_238._0_8_ = (ulong)(uint)((float)iVar18 + -64.0) << 0x20;
      pDVar22 = olc::Renderable::operator_cast_to_Decal_(&this->javidLArmDownSprite);
      local_2e8._M_dataplus._M_p = (pointer)0x4000000040000000;
      olc::PixelGameEngine::DrawDecal
                (&this->super_PixelGameEngine,(vf2d *)local_238,pDVar22,(vf2d *)&local_2e8,
                 (Pixel *)&olc::WHITE.field_1);
      SpeechBubble::drawSelf(&this->currentSpeechBubble,&this->super_PixelGameEngine);
    }
    StatusBar::drawSelf(&this->statusBar,&this->super_PixelGameEngine);
    fVar27 = this->fadeoutTimer;
    if (3.0 <= fVar27) {
      fVar27 = 3.0;
    }
    fVar27 = fVar27 / 3.0;
    local_238._0_4_ = 0.0;
    local_238._4_4_ = 0.0;
    iVar18 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    iVar19 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    local_2e8._M_dataplus._M_p = (pointer)CONCAT44((float)iVar19,(float)iVar18);
LAB_0011740f:
    PVar20 = olc::PixelF(0.0,0.0,0.0,fVar27);
    olc::PixelGameEngine::FillRectDecal
              (&this->super_PixelGameEngine,(vf2d *)local_238,(vf2d *)&local_2e8,PVar20);
    break;
  case MACHINE:
    fVar27 = this->minigameTimer - fElapsedTime;
    this->minigameTimer = fVar27;
    if (fVar27 <= 0.0) {
      this->minigameTimer = 10.0;
      do {
        rVar16 = std::uniform_int_distribution<int>::operator()
                           (&this->minigameDistrib,&this->engine,&(this->minigameDistrib)._M_param);
      } while (rVar16 == this->curMinigameId);
      psVar3 = (this->minigames).
               super__Vector_base<std::shared_ptr<Minigame>,_std::allocator<std::shared_ptr<Minigame>_>_>
               ._M_impl.super__Vector_impl_data._M_start + rVar16;
      (this->currentMinigame).super___shared_ptr<Minigame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar3->super___shared_ptr<Minigame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->currentMinigame).super___shared_ptr<Minigame,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(psVar3->super___shared_ptr<Minigame,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
      this->curMinigameId = rVar16;
      (**((this->currentMinigame).super___shared_ptr<Minigame,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         _vptr_Minigame)();
    }
    uVar5 = this->armSwitchTimer;
    uVar6 = this->headBobTimer;
    this->armSwitchTimer = fElapsedTime + (float)uVar5;
    this->headBobTimer = fElapsedTime + (float)uVar6;
    peVar8 = (this->currentMinigame).super___shared_ptr<Minigame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    piVar1 = &this->internetPoints;
    (*peVar8->_vptr_Minigame[1])(peVar8,this,piVar1);
    if (this->internetPoints < 0) {
      *piVar1 = 0;
    }
    local_148 = &this->skillTree;
    bVar14 = SkillTree::tick(local_148,&this->super_PixelGameEngine,piVar1);
    if (bVar14) {
      this->armSwitchPeriod = this->armSwitchPeriod * 0.7;
    }
    this_00 = &this->statusBar;
    local_140 = piVar1;
    StatusBar::tick(this_00,&this->super_PixelGameEngine);
    if (this->headBobTimer <= this->headBobPeriod * 0.5) {
      iVar17 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      pRVar26 = &this->robotBaseSprite0;
    }
    else {
      iVar17 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      pRVar26 = &this->robotBaseSprite1;
    }
    local_238._0_8_ = (ulong)(uint)((float)iVar17 + -64.0) << 0x20;
    pDVar22 = olc::Renderable::operator_cast_to_Decal_(pRVar26);
    local_2e8._M_dataplus._M_p = (pointer)0x4000000040000000;
    olc::PixelGameEngine::DrawDecal
              (&this->super_PixelGameEngine,(vf2d *)local_238,pDVar22,(vf2d *)&local_2e8,
               (Pixel *)&olc::WHITE.field_1);
    if (this->headBobPeriod <= this->headBobTimer) {
      this->headBobTimer = this->headBobTimer - this->headBobPeriod;
    }
    if (0.016 <= this->armSwitchPeriod) {
      if (this->armSwitchTimer <= this->armSwitchPeriod * 0.5) {
        iVar18 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        local_238._0_8_ = (ulong)(uint)((float)iVar18 + -64.0) << 0x20;
        pDVar22 = olc::Renderable::operator_cast_to_Decal_(&this->robotRArmDownSprite);
        local_2e8._M_dataplus._M_p = (pointer)0x4000000040000000;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_238,pDVar22,(vf2d *)&local_2e8,
                   (Pixel *)&olc::WHITE.field_1);
        iVar17 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pRVar26 = &this->robotLArmUpSprite;
      }
      else {
        iVar18 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        local_238._0_8_ = (ulong)(uint)((float)iVar18 + -64.0) << 0x20;
        pDVar22 = olc::Renderable::operator_cast_to_Decal_(&this->robotRArmUpSprite);
        local_2e8._M_dataplus._M_p = (pointer)0x4000000040000000;
        olc::PixelGameEngine::DrawDecal
                  (&this->super_PixelGameEngine,(vf2d *)local_238,pDVar22,(vf2d *)&local_2e8,
                   (Pixel *)&olc::WHITE.field_1);
        iVar17 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
        pRVar26 = &this->robotLArmDownSprite;
      }
      local_238._0_8_ = (ulong)(uint)((float)iVar17 + -64.0) << 0x20;
      pDVar22 = olc::Renderable::operator_cast_to_Decal_(pRVar26);
    }
    else {
      iVar18 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
      local_238._0_8_ = (ulong)(uint)((float)iVar18 + -64.0) << 0x20;
      iVar17 = rand();
      pDVar22 = olc::Renderable::operator_cast_to_Decal_
                          ((this->fastHandSprites).
                           super__Vector_base<olc::Renderable,_std::allocator<olc::Renderable>_>.
                           _M_impl.super__Vector_impl_data._M_start + iVar17 % 3);
    }
    local_2e8._M_dataplus._M_p = (pointer)0x4000000040000000;
    olc::PixelGameEngine::DrawDecal
              (&this->super_PixelGameEngine,(vf2d *)local_238,pDVar22,(vf2d *)&local_2e8,
               (Pixel *)&olc::WHITE.field_1);
    while( true ) {
      if (this->armSwitchTimer < this->armSwitchPeriod) break;
      this->armSwitchTimer = this->armSwitchTimer - this->armSwitchPeriod;
      StatusBar::addWork(this_00);
    }
    peVar8 = (this->currentMinigame).super___shared_ptr<Minigame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    (*peVar8->_vptr_Minigame[2])(peVar8,this);
    local_238._0_4_ = 0.0;
    local_238._4_4_ = 5.0;
    pDVar22 = olc::Renderable::operator_cast_to_Decal_(&this->ipSprite);
    local_2e8._M_dataplus._M_p = (pointer)0x3f8000003f800000;
    olc::PixelGameEngine::DrawDecal
              (&this->super_PixelGameEngine,(vf2d *)local_238,pDVar22,(vf2d *)&local_2e8,
               (Pixel *)&olc::WHITE.field_1);
    local_2e8._M_dataplus._M_p = (pointer)0x4110000041800000;
    uVar9 = this->internetPoints;
    __val = -uVar9;
    if (0 < (long)uVar9) {
      __val = uVar9;
    }
    __len = 1;
    if (9 < __val) {
      uVar24 = __val;
      uVar13 = 4;
      do {
        __len = uVar13;
        if (uVar24 < 100) {
          __len = __len - 2;
          goto LAB_00116562;
        }
        if (uVar24 < 1000) {
          __len = __len - 1;
          goto LAB_00116562;
        }
        if (uVar24 < 10000) goto LAB_00116562;
        bVar14 = 99999 < uVar24;
        uVar24 = uVar24 / 10000;
        uVar13 = __len + 4;
      } while (bVar14);
      __len = __len + 1;
    }
LAB_00116562:
    local_238._0_8_ = &local_228;
    std::__cxx11::string::_M_construct((ulong)local_238,(char)__len - (char)((long)uVar9 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)(local_238._0_8_ - ((long)uVar9 >> 0x3f)),__len,__val);
    local_2c8.x = 1.0;
    local_2c8.y = 1.0;
    olc::PixelGameEngine::DrawStringDecal
              (&this->super_PixelGameEngine,(vf2d *)&local_2e8,(string *)local_238,
               (Pixel)olc::WHITE.field_1,&local_2c8);
    piVar1 = local_140;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._0_8_ != &local_228) {
      operator_delete((void *)local_238._0_8_,local_228._M_allocated_capacity + 1);
    }
    SkillTree::drawSelf(local_148,&this->super_PixelGameEngine,piVar1);
    StatusBar::drawSelf(this_00,&this->super_PixelGameEngine);
    bVar14 = StatusBar::done(this_00);
    if (bVar14) {
      this->winFadeTimer = fElapsedTime + this->winFadeTimer;
    }
    local_238._0_4_ = 0.0;
    local_238._4_4_ = 0.0;
    iVar18 = olc::PixelGameEngine::ScreenWidth(&this->super_PixelGameEngine);
    iVar19 = olc::PixelGameEngine::ScreenHeight(&this->super_PixelGameEngine);
    local_2e8._M_dataplus._M_p = (pointer)CONCAT44((float)iVar19,(float)iVar18);
    PVar20 = olc::PixelF(0.0,0.0,0.0,this->winFadeTimer * 0.5);
    olc::PixelGameEngine::FillRectDecal
              (&this->super_PixelGameEngine,(vf2d *)local_238,(vf2d *)&local_2e8,PVar20);
    if (2.0 <= this->winFadeTimer) {
      this->state = WIN;
    }
    break;
  case WIN:
    local_238._0_4_ = 0.0;
    local_238._4_4_ = 0.0;
    pDVar22 = olc::Renderable::operator_cast_to_Decal_(&this->background);
    local_2e8._M_dataplus._M_p = (pointer)0x3f8000003f800000;
    olc::PixelGameEngine::DrawDecal
              (&this->super_PixelGameEngine,(vf2d *)local_238,pDVar22,(vf2d *)&local_2e8,
               (Pixel *)&olc::WHITE.field_1);
  }
  return true;
}

Assistant:

bool Game::OnUserUpdate(float fElapsedTime) {
    switch(state) {
	case CurrentState::MENU:
	    {
		const auto mousePos = GetMousePos();
		if (mousePos.x >= ScreenWidth() / 2 - 50 && mousePos.x <= ScreenWidth() / 2 + 50 &&
			mousePos.y >= ScreenHeight() / 2 - 10 && mousePos.y <= ScreenHeight() / 2 + 10 &&
			GetMouse(0).bPressed &&
			!started) {
		    started = true;
		}
		if (started) {
		    menuFadeTimer += fElapsedTime;
		}
		if (menuFadeTimer >= 2.0f) {
		    state = CurrentState::FIRST_PHASE;
		}
		DrawStringDecal(
			olc::vf2d{float(ScreenWidth() / 2), 40.0f} -
			GetTextSize("The Great\n   MMO  \n Machine "),
			"The Great\n   MMO  \n Machine ",
			olc::BLUE,
			{2.0f, 2.0f});
		FillRectDecal(
			{ScreenWidth() / 2 - 50.0f, ScreenHeight() / 2 - 10.0f},
			{100.0f, 20.0f},
			olc::WHITE);
		DrawStringDecal(
			olc::vf2d{float(ScreenWidth() / 2), float(ScreenHeight() / 2)} -
			GetTextSize("Play") / 2,
			"Play",
			olc::BLUE);
		FillRectDecal({0.0f, 0.0f},
			{float(ScreenWidth()), float(ScreenHeight())},
			olc::PixelF(0.0f, 0.0f, 0.0f, menuFadeTimer / 2));
		break;
	    }
	case CurrentState::FIRST_PHASE:
	    {
		//Update
		switch (cutsceneState) {
		    case 0:
			currentSpeechBubble = SpeechBubble{
			    "Hmm, I really need a new\nvideo idea...",
			    "res/sounds/hmm.wav",
			    {70, ScreenHeight() - 64},
			    {ScreenWidth() - 76, 64},
			    speechBubbleSprite
			};
			currentSpeechBubble.play(soloud);
			cutsceneState = 1;
			break;
		    case 1:
			if (currentSpeechBubble.getTimePastEnd() >= 3) {
			    currentSpeechBubble = SpeechBubble{
				"I know, I'm gonna make an mmo",
				"res/sounds/iknow.wav",
				{70, ScreenHeight() - 64},
				{ScreenWidth() - 76, 64},
				speechBubbleSprite
			    };
			    currentSpeechBubble.play(soloud);
			    cutsceneState = 2;
			}
			break;
		    case 2:
			if (currentSpeechBubble.getTimePastEnd() >= 3) {
			    cutsceneState = 3;
			}
			break;
		    case 3:
			if (GetKey(olc::A).bPressed) {
			    aPressed = true;
			}
			if (GetKey(olc::D).bPressed && aPressed) {
			    statusBar.addWork();
			    aPressed = false;
			    pressCounter++;
			}
			if (pressCounter == 30) {
			    cutsceneState = 4;
			}
			break;
		    case 4:
			currentSpeechBubble = SpeechBubble{
			    "Eugh, this is going slowly",
			    "res/sounds/eughh.wav",
			    {70, ScreenHeight() - 64},
			    {ScreenWidth() - 76, 64},
			    speechBubbleSprite
			};
			currentSpeechBubble.play(soloud);
			cutsceneState = 5;
			break;
		    case 5:
			if (currentSpeechBubble.getTimePastEnd() >= 3) {
			    currentSpeechBubble = SpeechBubble{
				"I know, I'm gonna make an mmo\nmaking machine, there's no\nway that goes wrong",
				"res/sounds/mmo.wav",
				{70, ScreenHeight() - 64},
				{ScreenWidth() - 76, 64},
				speechBubbleSprite
			    };
			    currentSpeechBubble.play(soloud);
			    cutsceneState = 6;
			}
			break;
		    case 6:
			if (currentSpeechBubble.getTimePastEnd() >= 3) {
			    cutsceneState = 7;
			}
			break;
		    case 7:
			fadeoutTimer += fElapsedTime;
			if (fadeoutTimer >= 4.0f) {
			    state = CurrentState::MACHINE;
			}
			break;
		}
		currentSpeechBubble.tick(fElapsedTime);

		//Draw
		DrawDecal({0, ScreenHeight() - 64.0f}, javidBaseSprite, {2, 2});

		if (cutsceneState == 3) {
		    if (aPressed) {
			DrawDecal({float(ScreenWidth() / 2 - 40 - aButtonSprite.Sprite()->width),
				float(ScreenHeight() / 2 - aButtonSprite.Sprite()->height / 2)},
				aButtonPressedSprite);
			DrawDecal({float(ScreenWidth() / 2 + 40),
				float(ScreenHeight() / 2 - dButtonSprite.Sprite()->height / 2)},
				dButtonSprite);
			DrawDecal({0, ScreenHeight() - 64.0f}, javidRArmDownSprite, {2, 2});
			DrawDecal({0, ScreenHeight() - 64.0f}, javidLArmUpSprite, {2, 2});
		    } else {
			DrawDecal({float(ScreenWidth() / 2 - 40 - aButtonSprite.Sprite()->width),
				float(ScreenHeight() / 2 - aButtonSprite.Sprite()->height / 2)},
				aButtonSprite);
			DrawDecal({float(ScreenWidth() / 2 + 40),
				float(ScreenHeight() / 2 - dButtonSprite.Sprite()->height / 2)},
				dButtonPressedSprite);
			DrawDecal({0, ScreenHeight() - 64.0f}, javidRArmUpSprite, {2, 2});
			DrawDecal({0, ScreenHeight() - 64.0f}, javidLArmDownSprite, {2, 2});
		    }
		} else {
		    DrawDecal({0, ScreenHeight() - 64.0f}, javidRArmDownSprite, {2, 2});
		    DrawDecal({0, ScreenHeight() - 64.0f}, javidLArmDownSprite, {2, 2});
		    currentSpeechBubble.drawSelf(this);
		}

		statusBar.drawSelf(this);

		float fadeoutColor = std::min(3.0f, fadeoutTimer) / 3.0f;

		FillRectDecal({0.0f, 0.0f},
			{float(ScreenWidth()), float(ScreenHeight())},
			olc::PixelF(0.0f, 0.0f, 0.0f, fadeoutColor));

		break;
	    }
	case CurrentState::MACHINE:
	    {
		//Update
		minigameTimer -= fElapsedTime;
		if (minigameTimer <= 0.0f) {
		    minigameTimer = 10.0f;
		    int nextMinigame = minigameDistrib(engine);
		    while (nextMinigame == curMinigameId) {
			nextMinigame = minigameDistrib(engine);
		    }
		    currentMinigame = minigames[nextMinigame];
		    curMinigameId = nextMinigame;
		    currentMinigame->start();
		}
		armSwitchTimer += fElapsedTime;
		headBobTimer += fElapsedTime;
		currentMinigame->tick(this, internetPoints);
		if (internetPoints < 0) {
		    internetPoints = 0;
		}
		if (skillTree.tick(this, internetPoints)) {
		    armSwitchPeriod *= 0.7f;
		}
		statusBar.tick(this);
		//Draw
		if (headBobTimer <= headBobPeriod / 2) {
		    DrawDecal({0, ScreenHeight() - 64.0f}, robotBaseSprite0, {2, 2});
		} else {
		    DrawDecal({0, ScreenHeight() - 64.0f}, robotBaseSprite1, {2, 2});
		}
		if (headBobTimer >= headBobPeriod) {
		    headBobTimer -= headBobPeriod;
		}

		if (armSwitchPeriod >= 0.016) {
		    if (armSwitchTimer <= armSwitchPeriod / 2) {
			DrawDecal({0, ScreenHeight() - 64.0f}, robotRArmDownSprite, {2, 2});
			DrawDecal({0, ScreenHeight() - 64.0f}, robotLArmUpSprite, {2, 2});
		    } else {
			DrawDecal({0, ScreenHeight() - 64.0f}, robotRArmUpSprite, {2, 2});
			DrawDecal({0, ScreenHeight() - 64.0f}, robotLArmDownSprite, {2, 2});
		    }
		} else {
		    DrawDecal({0, ScreenHeight() - 64.0f}, fastHandSprites[rand() % 3], {2, 2});
		}
		while (armSwitchTimer >= armSwitchPeriod) {
		    armSwitchTimer -= armSwitchPeriod;
		    statusBar.addWork();
		}

		currentMinigame->drawSelf(this);

		DrawDecal({0, 5}, ipSprite);
		DrawStringDecal({16, 9}, std::to_string(internetPoints));
		
		skillTree.drawSelf(this, internetPoints);
		statusBar.drawSelf(this);

		if (statusBar.done()) {
		    winFadeTimer += fElapsedTime;
		}

		FillRectDecal({0, 0},
			{float(ScreenWidth()), float(ScreenHeight())},
			olc::PixelF(0, 0, 0, winFadeTimer / 2));

		if (winFadeTimer >= 2.0f) {
		    state = CurrentState::WIN;
		}
		break;
	    }
	case CurrentState::WIN:
	    {
		DrawDecal({0, 0}, background);
		break;
	    }
    }
    return true;
}